

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,_QFileInfo>_>::insert
          (QMovableArrayOps<std::pair<QString,_QFileInfo>_> *this,qsizetype i,qsizetype n,
          parameter_type t)

{
  qsizetype *pqVar1;
  QFileInfo *this_00;
  pair<QString,_QFileInfo> *ppVar2;
  long in_FS_OFFSET;
  bool bVar3;
  Inserter local_80;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFileInfo *)(local_58 + 0x18);
  local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = (t->first).d.d;
  local_58._8_8_ = (t->first).d.ptr;
  local_58._16_8_ = (t->first).d.size;
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((QArrayData *)local_58._0_8_)->ref_)->ref_)._q_value.super___atomic_base<int>.
    _M_i = (((QArrayData *)&((QArrayData *)local_58._0_8_)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QFileInfo::QFileInfo(this_00,&t->second);
  bVar3 = (this->super_QGenericArrayOps<std::pair<QString,_QFileInfo>_>).
          super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>.size != 0;
  QArrayDataPointer<std::pair<QString,_QFileInfo>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)this,(uint)(i == 0 && bVar3),n,
             (pair<QString,_QFileInfo> **)0x0,
             (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0x0);
  if (i == 0 && bVar3) {
    if (n != 0) {
      ppVar2 = (this->super_QGenericArrayOps<std::pair<QString,_QFileInfo>_>).
               super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>.ptr;
      do {
        ppVar2[-1].first.d.d = (Data *)local_58._0_8_;
        ppVar2[-1].first.d.ptr = (char16_t *)local_58._8_8_;
        ppVar2[-1].first.d.size = local_58._16_8_;
        if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)local_58._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_58._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        n = n + -1;
        QFileInfo::QFileInfo(&ppVar2[-1].second,this_00);
        ppVar2 = (this->super_QGenericArrayOps<std::pair<QString,_QFileInfo>_>).
                 super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>.ptr + -1;
        (this->super_QGenericArrayOps<std::pair<QString,_QFileInfo>_>).
        super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>.ptr = ppVar2;
        pqVar1 = &(this->super_QGenericArrayOps<std::pair<QString,_QFileInfo>_>).
                  super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>.size;
        *pqVar1 = *pqVar1 + 1;
      } while (n != 0);
    }
  }
  else {
    local_80.displaceFrom =
         (this->super_QGenericArrayOps<std::pair<QString,_QFileInfo>_>).
         super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>.ptr + i;
    local_80.displaceTo = local_80.displaceFrom + n;
    local_80.bytes =
         ((this->super_QGenericArrayOps<std::pair<QString,_QFileInfo>_>).
          super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>.size - i) * 0x20;
    local_80.data = (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)this;
    local_80.nInserts = n;
    memmove(local_80.displaceTo,local_80.displaceFrom,local_80.bytes);
    Inserter::insertFill(&local_80,(pair<QString,_QFileInfo> *)local_58,n);
    Inserter::~Inserter(&local_80);
  }
  QFileInfo::~QFileInfo(this_00);
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }